

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void REVaction_set_output_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  int iVar1;
  CMFormat format;
  EV_int_response response;
  undefined4 local_28;
  int local_24;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  iVar1 = EVaction_set_output(cm,*(EVstone *)((long)data + 4),*(EVaction *)((long)data + 8),
                              *(int *)((long)data + 0xc),*(EVstone *)((long)data + 0x10));
  _local_28 = CONCAT44(iVar1,*data);
  CMwrite(conn,format,&local_28);
  return;
}

Assistant:

static void
REVaction_set_output_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVaction_set_output_request *request = (EVaction_set_output_request *) data;
    int ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVaction_set_output(cm, request->stone, request->action, request->output_index, request->target_stone);
    response.ret = ret;;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}